

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,int *x,int ncat,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator,
                 vector<double,_std::allocator<double>_> *w)

{
  pointer pdVar1;
  size_t row;
  long lVar2;
  allocator_type local_59;
  double local_58;
  vector<double,_std::allocator<double>_> buffer_cnt;
  value_type_conflict local_38;
  
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&buffer_cnt,(long)(ncat + 1),&local_38,&local_59);
  if (st <= end) {
    pdVar1 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lVar2 = (long)x[ix_arr[st]];
      if ((long)x[ix_arr[st]] < 0) {
        lVar2 = (long)ncat;
      }
      buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar2] =
           pdVar1[ix_arr[st]] +
           buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      st = st + 1;
    } while (st <= end);
  }
  local_58 = calc_kurtosis_weighted_internal<std::vector<double,std::allocator<double>>,double>
                       (&buffer_cnt,x,ncat,buffer_prob,missing_action,cat_split_type,rnd_generator,w
                       );
  if (buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_58;
}

Assistant:

double calc_kurtosis_weighted(size_t ix_arr[], size_t st, size_t end, int x[], int ncat, double buffer_prob[],
                              MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator,
                              mapping &restrict w)
{
    std::vector<ldouble_safe> buffer_cnt(ncat+1, 0.);
    ldouble_safe w_this;

    for (size_t row = st; row <= end; row++)
    {
        w_this = w[ix_arr[row]];
        if (likely(x[ix_arr[row]] >= 0))
            buffer_cnt[x[ix_arr[row]]] += w_this;
        else
            buffer_cnt[ncat] += w_this;
    }
    
    return calc_kurtosis_weighted_internal<mapping, ldouble_safe>(
                                           buffer_cnt, x, ncat,
                                           buffer_prob, missing_action, cat_split_type,
                                           rnd_generator, w);
}